

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O1

vector<float,_std::allocator<float>_> *
irwincolor::rgb2hsv(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
                   vector<float,_std::allocator<float>_> *rgb)

{
  float fVar1;
  float *pfVar2;
  double dVar3;
  pointer pfVar4;
  value_type_conflict3 *__val;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pfVar4 = (pointer)operator_new(0xc);
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = pfVar4;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = pfVar4;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = pfVar4 + 3;
  *pfVar4 = 0.0;
  pfVar4[1] = 0.0;
  pfVar4[2] = 0.0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = pfVar4 + 3;
  pfVar2 = (rgb->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  fVar8 = *pfVar2;
  fVar6 = pfVar2[1];
  fVar1 = pfVar2[2];
  fVar7 = fVar6;
  if (fVar8 <= fVar6) {
    fVar7 = fVar8;
  }
  fVar5 = fVar1;
  if (fVar7 <= fVar1) {
    fVar5 = fVar7;
  }
  if ((fVar8 <= fVar6) || (fVar8 <= fVar1)) {
    if ((fVar6 <= fVar8) || (fVar6 <= fVar1)) {
      pfVar4[2] = fVar1;
      fVar8 = fVar1 - fVar5;
      fVar6 = 0.0;
      if (0.0 < fVar8) {
        fVar6 = (*pfVar2 - pfVar2[1]) / fVar8 + 4.0;
      }
    }
    else {
      pfVar4[2] = fVar6;
      fVar8 = fVar6 - fVar5;
      fVar6 = (pfVar2[2] - *pfVar2) / fVar8 + 2.0;
    }
  }
  else {
    pfVar4[2] = fVar8;
    fVar8 = fVar8 - fVar5;
    dVar3 = fmod((double)((pfVar2[1] - pfVar2[2]) / fVar8),6.0);
    fVar6 = (float)dVar3;
  }
  *pfVar4 = fVar6 * 60.0;
  pfVar4[1] = (float)(-(uint)(0.0 < pfVar4[2]) & (uint)(fVar8 / pfVar4[2]));
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> rgb2hsv(const std::vector<float>& rgb)
{
	std::vector<float> hsv(3);
	float m = std::min(std::min((double) rgb[0], (double) rgb[1]), (double) rgb[2]);
	float c, hp;
	if (rgb[0] > rgb[1] && rgb[0] > rgb[2])
	{
		c = rgb[0] - m;
		hsv[2] = rgb[0];
		hp = fmod((rgb[1] - rgb[2]) / c, 6.0);
	}
	else if (rgb[1] > rgb[2] && rgb[1] > rgb[0])
	{
		c = rgb[1] - m;
		hsv[2] = rgb[1];
		hp = (rgb[2] - rgb[0]) / c + 2.0;
	}
	else
	{
		c = rgb[2] - m;
		hsv[2] = rgb[2];
		hp = c <= 0.0 ? 0.0 : (rgb[0] - rgb[1]) / c + 4.0;
	}
	hsv[0] = hp * 60.0;
	hsv[1] = hsv[2] <= 0.0 ? 0.0 : c / hsv[2];
	return hsv;
}